

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  int iVar1;
  Printer *pPVar2;
  string *value1;
  pointer ppVar3;
  long lVar4;
  int j;
  long lVar5;
  long lVar6;
  int i;
  EnumDescriptor *enum_descriptor;
  ulong uVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar4 = 0; lVar4 < *(int *)(this->file_ + 0x68); lVar4 = lVar4 + 1) {
    enum_descriptor = (EnumDescriptor *)(lVar4 * 0x38 + *(long *)(this->file_ + 0x70));
    PrintEnum(this,enum_descriptor);
    pPVar2 = this->printer_;
    value1 = *(string **)enum_descriptor;
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              (&local_58.first,this,enum_descriptor);
    io::Printer::Print(pPVar2,"$name$ = enum_type_wrapper.EnumTypeWrapper($descriptor_name$)","name"
                       ,value1,"descriptor_name",&local_58.first);
    std::__cxx11::string::~string((string *)&local_58);
    io::Printer::Print(this->printer_,"\n");
    lVar6 = 0x10;
    for (lVar5 = 0; lVar5 < *(int *)(enum_descriptor + 0x2c); lVar5 = lVar5 + 1) {
      iVar1 = *(int *)(*(long *)(enum_descriptor + 0x30) + lVar6);
      std::__cxx11::string::string
                ((string *)&local_58,*(string **)(*(long *)(enum_descriptor + 0x30) + -0x10 + lVar6)
                );
      local_58.second = iVar1;
      std::
      vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
      ::emplace_back<std::pair<std::__cxx11::string,int>>
                ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                  *)&top_level_enum_values,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      lVar6 = lVar6 + 0x28;
    }
  }
  lVar4 = 0;
  uVar7 = 0;
  while( true ) {
    ppVar3 = top_level_enum_values.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = this->printer_;
    if ((ulong)(((long)top_level_enum_values.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)top_level_enum_values.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar7) break;
    SimpleItoa_abi_cxx11_
              (&local_58.first,
               (protobuf *)
               (ulong)*(uint *)((long)&(top_level_enum_values.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second + lVar4),
               (int)(((long)top_level_enum_values.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)top_level_enum_values.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) % 0x28));
    io::Printer::Print(pPVar2,"$name$ = $value$\n","name",
                       (string *)((long)&(ppVar3->first)._M_dataplus._M_p + lVar4),"value",
                       &local_58.first);
    std::__cxx11::string::~string((string *)&local_58);
    uVar7 = uVar7 + 1;
    lVar4 = lVar4 + 0x28;
  }
  io::Printer::Print(pPVar2,"\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&top_level_enum_values);
  return;
}

Assistant:

void Generator::PrintTopLevelEnums() const {
  std::vector<std::pair<string, int> > top_level_enum_values;
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    PrintEnum(enum_descriptor);
    printer_->Print("$name$ = "
                    "enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                    "name", enum_descriptor.name(),
                    "descriptor_name",
                    ModuleLevelDescriptorName(enum_descriptor));
    printer_->Print("\n");

    for (int j = 0; j < enum_descriptor.value_count(); ++j) {
      const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(j);
      top_level_enum_values.push_back(
          std::make_pair(value_descriptor.name(), value_descriptor.number()));
    }
  }

  for (int i = 0; i < top_level_enum_values.size(); ++i) {
    printer_->Print("$name$ = $value$\n",
                    "name", top_level_enum_values[i].first,
                    "value", SimpleItoa(top_level_enum_values[i].second));
  }
  printer_->Print("\n");
}